

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  cmTarget *pcVar4;
  string *psVar5;
  char *pcVar6;
  string *extraout_RDX;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fproj;
  string language;
  cmGeneratedFileStream fout;
  string local_338;
  string local_318;
  long *local_2e8 [2];
  long local_2d8 [2];
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  long *local_2a0;
  undefined8 local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  size_type local_288;
  pointer local_280;
  size_t local_278;
  char *local_270;
  size_type local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  pcVar3 = (pointer)psVar5->_M_string_length;
  puStack_58 = local_50;
  local_60 = 1;
  local_50[0] = 0x2f;
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
            (local_2e8,this->LocalGenerator,this->GeneratorTarget);
  pcVar6 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
  local_2b8._M_allocated_capacity = local_60;
  local_2b8._8_8_ = puStack_58;
  local_2a8 = local_2e8[1];
  local_2a0 = local_2e8[0];
  paVar1 = &local_318.field_2;
  local_318._M_dataplus._M_p = &DAT_00000001;
  local_318.field_2._M_local_buf[0] = '/';
  local_298 = 1;
  local_280 = (this->Name)._M_dataplus._M_p;
  local_288 = (this->Name)._M_string_length;
  local_318._M_string_length = (size_type)paVar1;
  local_2c8._0_8_ = pcVar3;
  local_2c8._8_8_ = pcVar2;
  local_290 = paVar1;
  local_278 = strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
  local_270 = pcVar6;
  views._M_len = 6;
  views._M_array = (iterator)local_2c8;
  cmCatViews_abi_cxx11_(&local_338,views);
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  pcVar4 = this->GeneratorTarget->Target;
  local_2c8._0_8_ = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"GENERATOR_FILE_NAME","");
  cmTarget::SetProperty(pcVar4,(string *)local_2c8,&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._0_8_ != &local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  pcVar4 = this->GeneratorTarget->Target;
  local_2c8._0_8_ = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"GENERATOR_FILE_NAME_EXT","");
  pcVar6 = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar4,(string *)local_2c8,pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._0_8_ != &local_2b8) {
    operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2c8,&local_338,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2c8,true);
  cmGlobalGhsMultiGenerator::WriteFileHeader
            ((cmGlobalGhsMultiGenerator *)
             (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)local_2c8);
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)local_2c8);
  if (this->TagType != CUSTOM_TARGET) {
    psVar5 = &this->ConfigName;
    cmGeneratorTarget::GetLinkerLanguage(&local_318,this->GeneratorTarget,psVar5);
    WriteTargetSpecifics(this,(ostream *)local_2c8,psVar5);
    SetCompilerFlags(this,psVar5,&local_318);
    WriteCompilerFlags(this,(ostream *)local_2c8,extraout_RDX,&local_318);
    WriteCompilerDefinitions(this,(ostream *)local_2c8,psVar5,&local_318);
    WriteIncludes(this,(ostream *)local_2c8,psVar5,&local_318);
    WriteTargetLinkLine(this,(ostream *)local_2c8,psVar5);
    WriteBuildEvents(this,(ostream *)local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar1) {
      operator_delete(local_318._M_dataplus._M_p,
                      CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                               local_318.field_2._M_local_buf[0]) + 1);
    }
  }
  WriteSources(this,(ostream *)local_2c8);
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2c8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj =
    cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             '/', this->Name, cmGlobalGhsMultiGenerator::FILE_EXTENSION);

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME", fproj);
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}